

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibReturnCanonicals(uint *pCanons)

{
  int local_390;
  uint local_38c;
  int k;
  int i;
  int Visits [222];
  uint *pCanons_local;
  
  Visits._880_8_ = pCanons;
  memset(&k,0,0x378);
  local_390 = 0;
  for (local_38c = 0; (int)local_38c < 0x10000; local_38c = local_38c + 1) {
    if ((&k)[s_DarLib->pMap[(int)local_38c]] == 0) {
      (&k)[s_DarLib->pMap[(int)local_38c]] = 1;
      *(uint *)(Visits._880_8_ + (long)local_390 * 4) = local_38c << 0x10 | local_38c;
      local_390 = local_390 + 1;
    }
  }
  if (local_390 == 0xde) {
    return;
  }
  __assert_fail("k == 222",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darLib.c"
                ,0xde,"void Dar_LibReturnCanonicals(unsigned int *)");
}

Assistant:

void Dar_LibReturnCanonicals( unsigned * pCanons )
{
    int Visits[222] = {0};
    int i, k;
    // find canonical truth tables
    for ( i = k = 0; i < (1<<16); i++ )
        if ( !Visits[s_DarLib->pMap[i]] )
        {
            Visits[s_DarLib->pMap[i]] = 1;
            pCanons[k++] = ((i<<16) | i);
        }
    assert( k == 222 );
}